

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint64_t fmt::internal::MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_>::type
                   (uint param_1)

{
  uint param_0_local;
  
  return 3;
}

Assistant:

MakeValue(long value) {
    // To minimize the number of types we need to deal with, long is
    // translated either to int or to long long depending on its size.
    if (const_check(sizeof(long) == sizeof(int)))
      int_value = static_cast<int>(value);
    else
      long_long_value = value;
  }